

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestGroupToFile(JUnitTestOutput *this)

{
  long *in_RDI;
  undefined1 local_10 [16];
  
  (**(code **)(*in_RDI + 0xa8))(local_10,in_RDI,in_RDI[3] + 0x18);
  (**(code **)(*in_RDI + 0xb0))(in_RDI,local_10);
  SimpleString::~SimpleString((SimpleString *)0x20ecf3);
  (**(code **)(*in_RDI + 0xd0))();
  (**(code **)(*in_RDI + 0xd8))();
  (**(code **)(*in_RDI + 0xe0))();
  (**(code **)(*in_RDI + 0xe8))();
  (**(code **)(*in_RDI + 0xf8))();
  (**(code **)(*in_RDI + 200))();
  return;
}

Assistant:

void JUnitTestOutput::writeTestGroupToFile()
{
    openFileForWrite(createFileName(impl_->results_.group_));
    writeXmlHeader();
    writeTestSuiteSummary();
    writeProperties();
    writeTestCases();
    writeFileEnding();
    closeFile();
}